

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O3

int Abc_NtkReduceNodes(Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodes)

{
  uint *puVar1;
  Abc_Obj_t *pObj;
  int iVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  
  if (pNtk->ntkType == ABC_NTK_LOGIC) {
    iVar2 = vNodes->nSize;
    if (0 < iVar2) {
      lVar3 = 0;
      do {
        puVar1 = (uint *)((long)vNodes->pArray[lVar3] + 0x14);
        *puVar1 = *puVar1 | 0x10;
        lVar3 = lVar3 + 1;
        iVar2 = vNodes->nSize;
      } while (lVar3 < iVar2);
    }
    pVVar4 = pNtk->vObjs;
    if (pVVar4->nSize < 1) {
      iVar5 = 0;
    }
    else {
      lVar3 = 0;
      iVar5 = 0;
      do {
        pObj = (Abc_Obj_t *)pVVar4->pArray[lVar3];
        if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0x1f) == 7)) {
          Abc_NtkDeleteObj(pObj);
          iVar5 = iVar5 + 1;
          pVVar4 = pNtk->vObjs;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < pVVar4->nSize);
      iVar2 = vNodes->nSize;
    }
    if (0 < iVar2) {
      lVar3 = 0;
      do {
        puVar1 = (uint *)((long)vNodes->pArray[lVar3] + 0x14);
        *puVar1 = *puVar1 & 0xffffffef;
        lVar3 = lVar3 + 1;
      } while (lVar3 < vNodes->nSize);
    }
    iVar2 = Abc_NtkCheck(pNtk);
    if (iVar2 == 0) {
      puts("Abc_NtkCleanup: The network check has failed.");
    }
    return iVar5;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                ,0x21d,"int Abc_NtkReduceNodes(Abc_Ntk_t *, Vec_Ptr_t *)");
}

Assistant:

int Abc_NtkReduceNodes( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pNode;
    int i, Counter;
    assert( Abc_NtkIsLogic(pNtk) );
    // mark the nodes reachable from the POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        pNode->fMarkA = 1;
    // remove the non-marked nodes
    Counter = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( pNode->fMarkA == 0 )
        {
            Abc_NtkDeleteObj( pNode );
            Counter++;
        }
    // unmark the remaining nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        pNode->fMarkA = 0;
    // check
    if ( !Abc_NtkCheck( pNtk ) )
        printf( "Abc_NtkCleanup: The network check has failed.\n" );
    return Counter;
}